

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O1

void __thiscall
soplex::SPxLPBase<double>::doAddRows(SPxLPBase<double> *this,LPRowSetBase<double> *set,bool scale)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Nonzero<double> *pNVar4;
  Item *pIVar5;
  bool bVar6;
  long lVar7;
  ulong *puVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  Item *pIVar14;
  double dVar15;
  DataArray<int> newCols;
  LPColBase<double> empty;
  DataArray<int> local_b0;
  LPRowSetBase<double> *local_98;
  undefined8 uStack_90;
  DataKey local_80;
  double local_78;
  undefined8 uStack_70;
  LPColBase<double> local_68;
  
  iVar1 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  local_b0.data = (int *)0x0;
  local_b0.memFactor = 1.2;
  local_b0.thesize = 0;
  if (0 < iVar1) {
    local_b0.thesize = iVar1;
  }
  local_b0.themax = 1;
  if (0 < iVar1) {
    local_b0.themax = local_b0.thesize;
  }
  spx_alloc<int*>(&local_b0.data,local_b0.themax);
  iVar1 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
  iVar2 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  if ((SPxLPBase<double> *)set != this) {
    LPRowSetBase<double>::add(&this->super_LPRowSetBase<double>,set);
  }
  iVar13 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  lVar7 = (long)iVar13;
  if (0 < lVar7) {
    memset(local_b0.data + ((lVar7 + -1) - (ulong)(iVar13 - 1)),0,lVar7 * 4);
  }
  lVar7 = (long)(set->super_SVSetBase<double>).set.thenum;
  if (0 < lVar7) {
    local_98 = set;
    do {
      pIVar14 = (local_98->super_SVSetBase<double>).set.theitem;
      iVar13 = (local_98->super_SVSetBase<double>).set.thekey[lVar7 + -1].idx;
      lVar11 = (long)pIVar14[iVar13].data.super_SVectorBase<double>.memused;
      if (0 < lVar11) {
        do {
          iVar3 = pIVar14[iVar13].data.super_SVectorBase<double>.m_elem[lVar11 + -1].idx;
          if ((this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum <= iVar3) {
            LPColBase<double>::LPColBase(&local_68,0);
            DataArray<int>::reSize(&local_b0,iVar3 + 1);
            iVar12 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
            lVar9 = (long)iVar12;
            if (iVar12 <= iVar3) {
              iVar12 = (iVar3 - iVar12) + 1;
              do {
                local_b0.data[lVar9] = 0;
                local_80.info = 0;
                local_80.idx = -1;
                LPColSetBase<double>::add(&this->super_LPColSetBase<double>,&local_80,&local_68);
                lVar9 = lVar9 + 1;
                iVar12 = iVar12 + -1;
              } while (iVar12 != 0);
            }
            local_68.vec._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_003b0660;
            if (local_68.vec.theelem != (Nonzero<double> *)0x0) {
              free(local_68.vec.theelem);
              local_68.vec.theelem = (Nonzero<double> *)0x0;
            }
          }
          local_b0.data[iVar3] = local_b0.data[iVar3] + 1;
          bVar6 = 1 < lVar11;
          lVar11 = lVar11 + -1;
        } while (bVar6);
      }
      bVar6 = 1 < lVar7;
      lVar7 = lVar7 + -1;
    } while (bVar6);
  }
  lVar7 = (long)(this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  if (0 < lVar7) {
    lVar7 = lVar7 + 1;
    do {
      if (0 < local_b0.data[lVar7 + -2]) {
        pIVar14 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem +
                  (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[lVar7 + -2].
                  idx;
        iVar13 = local_b0.data[lVar7 + -2] + (pIVar14->data).super_SVectorBase<double>.memused;
        SVSetBase<double>::xtend
                  (&(this->super_LPColSetBase<double>).super_SVSetBase<double>,
                   (SVectorBase<double> *)pIVar14,iVar13);
        (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem
        [(this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[lVar7 + -2].idx].data
        .super_SVectorBase<double>.memused = iVar13;
      }
      lVar7 = lVar7 + -1;
    } while (1 < lVar7);
  }
  iVar13 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
  lVar7 = (long)iVar13;
  if (iVar1 < iVar13) {
    puVar8 = (ulong *)__tls_get_addr(&PTR_003b6b60);
    local_98 = (LPRowSetBase<double> *)*puVar8;
    uStack_90 = 0;
    local_78 = -(double)local_98;
    uStack_70 = 0x8000000000000000;
    do {
      lVar11 = lVar7 + -1;
      lVar7 = lVar7 + -1;
      pIVar14 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
                (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[lVar11].idx;
      iVar13 = 0;
      if (scale) {
        iVar13 = (*this->lp_scaler->_vptr_SPxScaler[1])
                           (this->lp_scaler,pIVar14,&(this->super_LPColSetBase<double>).scaleExp);
        dVar15 = (this->super_LPRowSetBase<double>).right.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar7];
        ::soplex::infinity::__tls_init();
        if (dVar15 < (double)local_98) {
          dVar15 = ldexp((this->super_LPRowSetBase<double>).right.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar7],iVar13);
          (this->super_LPRowSetBase<double>).right.val.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar7] = dVar15;
        }
        dVar15 = (this->super_LPRowSetBase<double>).left.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar7];
        ::soplex::infinity::__tls_init();
        if (local_78 < dVar15) {
          dVar15 = ldexp((this->super_LPRowSetBase<double>).left.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar7],iVar13);
          (this->super_LPRowSetBase<double>).left.val.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar7] = dVar15;
        }
        dVar15 = ldexp((this->super_LPRowSetBase<double>).object.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar7],iVar13);
        (this->super_LPRowSetBase<double>).object.val.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [lVar7] = dVar15;
        (this->super_LPRowSetBase<double>).scaleExp.data[lVar7] = iVar13;
      }
      lVar11 = (long)(pIVar14->data).super_SVectorBase<double>.memused;
      if (0 < lVar11) {
        lVar9 = lVar11 + 1;
        lVar11 = lVar11 << 4;
        do {
          pNVar4 = (pIVar14->data).super_SVectorBase<double>.m_elem;
          iVar3 = *(int *)((long)pNVar4 + lVar11 + -8);
          pIVar5 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem;
          iVar12 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[iVar3].idx;
          lVar10 = (long)pIVar5[iVar12].data.super_SVectorBase<double>.memused -
                   (long)local_b0.data[iVar3];
          local_b0.data[iVar3] = local_b0.data[iVar3] + -1;
          pIVar5[iVar12].data.super_SVectorBase<double>.m_elem[lVar10].idx = (int)lVar7;
          if (scale) {
            dVar15 = ldexp(*(double *)((long)&pNVar4[-1].val + lVar11),
                           (this->super_LPColSetBase<double>).scaleExp.data[iVar3] + iVar13);
            *(double *)((long)&(pIVar14->data).super_SVectorBase<double>.m_elem[-1].val + lVar11) =
                 dVar15;
          }
          pIVar5[iVar12].data.super_SVectorBase<double>.m_elem[lVar10].val =
               *(double *)((long)&(pIVar14->data).super_SVectorBase<double>.m_elem[-1].val + lVar11)
          ;
          lVar9 = lVar9 + -1;
          lVar11 = lVar11 + -0x10;
        } while (1 < lVar9);
      }
    } while (iVar1 < lVar7);
  }
  (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x50])
            (this,(ulong)(uint)((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.
                                thenum - iVar1));
  (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x51])
            (this,(ulong)(uint)((this->super_LPColSetBase<double>).super_SVSetBase<double>.set.
                                thenum - iVar2));
  if (local_b0.data != (int *)0x0) {
    free(local_b0.data);
  }
  return;
}

Assistant:

void doAddRows(const LPRowSetBase<R>& set, bool scale = false)
   {
      int i, j, k, ii, idx;
      SVectorBase<R>* col;
      DataArray < int > newCols(nCols());
      int oldRowNumber = nRows();
      int oldColNumber = nCols();

      if(&set != this)
         LPRowSetBase<R>::add(set);

      assert(LPRowSetBase<R>::isConsistent());
      assert(LPColSetBase<R>::isConsistent());

      // count additional nonzeros per column
      for(i = nCols() - 1; i >= 0; --i)
         newCols[i] = 0;

      for(i = set.num() - 1; i >= 0; --i)
      {
         const SVectorBase<R>& vec = set.rowVector(i);

         for(j = vec.size() - 1; j >= 0; --j)
         {
            // create new columns if required
            ii = vec.index(j);

            if(ii >= nCols())
            {
               LPColBase<R> empty;
               newCols.reSize(ii + 1);

               for(k = nCols(); k <= ii; ++k)
               {
                  newCols[k] = 0;
                  LPColSetBase<R>::add(empty);
               }
            }

            assert(ii < nCols());
            newCols[ii]++;
         }
      }

      // extend columns as required (backward because of memory efficiency reasons)
      for(i = nCols() - 1; i >= 0; --i)
      {
         if(newCols[i] > 0)
         {
            int len = newCols[i] + colVector(i).size();
            LPColSetBase<R>::xtend(i, len);

            /* preset the sizes: beware that this can irritate a consistency check call from xtend(). We need to set the
             * sizes here, because a possible garbage collection called from xtend might destroy the sizes again. */
            colVector_w(i).set_size(len);
         }
      }

      // compute new row scaling factor and insert new elements to column file
      for(i = nRows() - 1; i >= oldRowNumber; --i)
      {
         SVectorBase<R>& vec = rowVector_w(i);
         int newRowScaleExp = 0;

         DataArray <int>& colscaleExp = LPColSetBase<R>::scaleExp;

         // compute new row scaling factor and apply it to the sides
         if(scale)
         {
            newRowScaleExp = lp_scaler->computeScaleExp(vec, colscaleExp);

            if(rhs(i) < R(infinity))
               rhs_w(i) = spxLdexp(rhs_w(i), newRowScaleExp);

            if(lhs(i) > R(-infinity))
               lhs_w(i) = spxLdexp(lhs_w(i), newRowScaleExp);

            maxRowObj_w(i) = spxLdexp(maxRowObj_w(i), newRowScaleExp);

            LPRowSetBase<R>::scaleExp[i] = newRowScaleExp;
         }

         for(j = vec.size() - 1; j >= 0; --j)
         {
            k = vec.index(j);
            col = &colVector_w(k);
            idx = col->size() - newCols[k];
            assert(newCols[k] > 0);
            assert(idx >= 0);
            newCols[k]--;
            col->index(idx) = i;

            // apply new row and existing column scaling factors to both ColSet and RowSet
            if(scale)
               vec.value(j) = spxLdexp(vec.value(j), newRowScaleExp + colscaleExp[k]);

            col->value(idx) = vec.value(j);
         }
      }

#ifndef NDEBUG

      for(i = 0; i < nCols(); ++i)
         assert(newCols[i] == 0);

#endif

      assert(SPxLPBase<R>::isConsistent());

      assert(set.num() == nRows() - oldRowNumber);
      addedRows(nRows() - oldRowNumber);
      addedCols(nCols() - oldColNumber);
   }